

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm2d.c
# Opt level: O2

void av1_inv_txfm2d_add_64x32_c(int32_t *input,uint16_t *output,int stride,TX_TYPE tx_type,int bd)

{
  int32_t mod_input [2048];
  int txfm_buf [2176];
  int32_t local_4260 [1024];
  undefined1 local_3260 [4096];
  int32_t local_2260 [2188];
  
  memcpy(local_4260,input,0x1000);
  memset(local_3260,0,0x1000);
  inv_txfm2d_add_facade(local_4260,output,stride,local_2260,tx_type,'\f',bd);
  return;
}

Assistant:

void av1_inv_txfm2d_add_64x32_c(const int32_t *input, uint16_t *output,
                                int stride, TX_TYPE tx_type, int bd) {
  // Remap 32x32 input into a modified 64x32 by:
  // - Copying over these values in top-left 32x32 locations.
  // - Setting the rest of the locations to 0.
  int32_t mod_input[32 * 64];
  memcpy(mod_input, input, 32 * 32 * sizeof(*mod_input));
  memset(mod_input + 32 * 32, 0, 32 * 32 * sizeof(*mod_input));
  DECLARE_ALIGNED(32, int, txfm_buf[64 * 32 + 64 + 64]);
  inv_txfm2d_add_facade(mod_input, output, stride, txfm_buf, tx_type, TX_64X32,
                        bd);
}